

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alBufferf(void)

{
  uint32 name_00;
  ALenum param_00;
  float value_00;
  ALfloat value;
  ALenum param;
  ALuint name;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&param);
  if (io_failure == 0) {
    name_00 = IO_UINT32();
    param_00 = IO_ENUM();
    value_00 = IO_FLOAT();
    if (io_failure == 0) {
      visit_alBufferf((CallerInfo *)&param,name_00,param_00,value_00);
    }
  }
  return;
}

Assistant:

static void decode_alBufferf(void)
{
    IO_START(alBufferf);
    const ALuint name = IO_UINT32();
    const ALenum param = IO_ENUM();
    const ALfloat value = IO_FLOAT();
    if (!io_failure) visit_alBufferf(&callerinfo, name, param, value);
    IO_END();
}